

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolvmin.cpp
# Opt level: O3

void __thiscall
chrono::ChOptimizer::Eval_grad(ChOptimizer *this,ChVectorDynamic<> *x,ChVectorDynamic<> *gr)

{
  ChFx *pCVar1;
  int iVar2;
  long lVar3;
  double dVar4;
  ChVectorDynamic<> mdx;
  DenseStorage<double,__1,__1,_1,_0> local_38;
  double local_28;
  
  pCVar1 = this->afunctionGrad;
  if (pCVar1 != (ChFx *)0x0) {
    (*(code *)**(undefined8 **)pCVar1)(pCVar1,gr);
    return;
  }
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            (&local_38,(DenseStorage<double,__1,__1,_1,_0> *)x);
  local_28 = Eval_fx(this,(ChVectorDynamic<> *)&local_38);
  lVar3 = 0;
  while( true ) {
    iVar2 = (*this->_vptr_ChOptimizer[7])(this);
    if (iVar2 <= lVar3) {
      if (local_38.m_data != (double *)0x0) {
        free((void *)local_38.m_data[-1]);
      }
      return;
    }
    if (local_38.m_rows <= lVar3) break;
    local_38.m_data[lVar3] = this->grad_step + local_38.m_data[lVar3];
    dVar4 = Eval_fx(this,(ChVectorDynamic<> *)&local_38);
    if (((gr->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
         lVar3) ||
       ((gr->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data[lVar3]
             = (dVar4 - local_28) / this->grad_step, local_38.m_rows <= lVar3)) break;
    local_38.m_data[lVar3] = local_38.m_data[lVar3] - this->grad_step;
    lVar3 = lVar3 + 1;
  }
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
               );
}

Assistant:

void ChOptimizer::Eval_grad(const ChVectorDynamic<>& x, ChVectorDynamic<>& gr) {
    // Eval_grad(x->GetAddress(), gr->GetAddress());
    if (afunctionGrad) {
        afunctionGrad->Eval(gr, x);
    } else {
        // otherwise use BDF
        ChVectorDynamic<> mdx = x;

        double mf = Eval_fx(mdx);
        for (int mvar = 0; mvar < GetNumOfVars(); mvar++) {
            mdx(mvar) += grad_step;
            double mfd = Eval_fx(mdx);
            gr(mvar) = (mfd - mf) / (grad_step);
            mdx(mvar) -= grad_step;
        }
    }
}